

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

lostFraction llvm::trailingHexadecimalFraction(iterator p,iterator end,uint digitValue)

{
  uint uVar1;
  bool bVar2;
  uint hexDigit;
  uint digitValue_local;
  iterator end_local;
  iterator p_local;
  
  if (digitValue < 9) {
    end_local = p;
    if ((digitValue < 8) && (digitValue != 0)) {
      p_local._4_4_ = lfLessThanHalf;
    }
    else {
      while( true ) {
        bVar2 = false;
        if ((end_local != end) && (bVar2 = true, *end_local != '0')) {
          bVar2 = *end_local == '.';
        }
        if (!bVar2) break;
        end_local = end_local + 1;
      }
      if (end_local == end) {
        __assert_fail("p != end && \"Invalid trailing hexadecimal fraction!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x194,
                      "lostFraction llvm::trailingHexadecimalFraction(StringRef::iterator, StringRef::iterator, unsigned int)"
                     );
      }
      uVar1 = hexDigitValue(*end_local);
      if (uVar1 == 0xffffffff) {
        p_local._4_4_ = lfExactlyHalf;
        if (digitValue == 0) {
          p_local._4_4_ = lfExactlyZero;
        }
      }
      else {
        p_local._4_4_ = lfMoreThanHalf;
        if (digitValue == 0) {
          p_local._4_4_ = lfLessThanHalf;
        }
      }
    }
  }
  else {
    p_local._4_4_ = lfMoreThanHalf;
  }
  return p_local._4_4_;
}

Assistant:

static lostFraction
trailingHexadecimalFraction(StringRef::iterator p, StringRef::iterator end,
                            unsigned int digitValue)
{
  unsigned int hexDigit;

  /* If the first trailing digit isn't 0 or 8 we can work out the
     fraction immediately.  */
  if (digitValue > 8)
    return lfMoreThanHalf;
  else if (digitValue < 8 && digitValue > 0)
    return lfLessThanHalf;

  // Otherwise we need to find the first non-zero digit.
  while (p != end && (*p == '0' || *p == '.'))
    p++;

  assert(p != end && "Invalid trailing hexadecimal fraction!");

  hexDigit = hexDigitValue(*p);

  /* If we ran off the end it is exactly zero or one-half, otherwise
     a little more.  */
  if (hexDigit == -1U)
    return digitValue == 0 ? lfExactlyZero: lfExactlyHalf;
  else
    return digitValue == 0 ? lfLessThanHalf: lfMoreThanHalf;
}